

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O0

ngx_radix_node_t * ngx_radix_alloc(ngx_radix_tree_t *tree)

{
  char *pcVar1;
  ngx_radix_node_t *p;
  ngx_radix_tree_t *tree_local;
  
  if (tree->free == (ngx_radix_node_t *)0x0) {
    if (tree->size < 0x20) {
      pcVar1 = (char *)ngx_pmemalign(tree->pool,ngx_pagesize,ngx_pagesize);
      tree->start = pcVar1;
      if (tree->start == (char *)0x0) {
        return (ngx_radix_node_t *)0x0;
      }
      tree->size = ngx_pagesize;
    }
    tree_local = (ngx_radix_tree_t *)tree->start;
    tree->start = tree->start + 0x20;
    tree->size = tree->size - 0x20;
  }
  else {
    tree_local = (ngx_radix_tree_t *)tree->free;
    tree->free = tree->free->right;
  }
  return (ngx_radix_node_t *)tree_local;
}

Assistant:

static ngx_radix_node_t *
ngx_radix_alloc(ngx_radix_tree_t *tree)
{
    ngx_radix_node_t  *p;

    if (tree->free) {
        p = tree->free;
        tree->free = tree->free->right;
        return p;
    }

    if (tree->size < sizeof(ngx_radix_node_t)) {
        tree->start = ngx_pmemalign(tree->pool, ngx_pagesize, ngx_pagesize);
        if (tree->start == NULL) {
            return NULL;
        }

        tree->size = ngx_pagesize;
    }

    p = (ngx_radix_node_t *) tree->start;
    tree->start += sizeof(ngx_radix_node_t);
    tree->size -= sizeof(ngx_radix_node_t);

    return p;
}